

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O0

void __thiscall
tonk::MessageDecompressor::InsertUncompressed(MessageDecompressor *this,uint8_t *data,uint bytes)

{
  uint in_EDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  void *history;
  void *in_stack_ffffffffffffffa8;
  ZSTD_DCtx *dctx;
  
  if (in_EDX <= (in_RDI->entropy).hufTable[0xd66]) {
    if (24000 < (in_RDI->entropy).hufTable[0xd62] + (in_RDI->entropy).hufTable[0xd66]) {
      (in_RDI->entropy).hufTable[0xd62] = 0;
    }
    dctx = in_RDI;
    memcpy((void *)((long)((in_RDI->entropy).LLTable + -4) +
                   (ulong)(in_RDI->entropy).hufTable[0xd62]),in_RSI,(ulong)in_EDX);
    ZSTD_insertBlock(dctx,in_stack_ffffffffffffffa8,0x1d09d2);
    (in_RDI->entropy).hufTable[0xd62] = in_EDX + (in_RDI->entropy).hufTable[0xd62];
  }
  return;
}

Assistant:

void MessageDecompressor::InsertUncompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes > MaxCompressedMessagesBytes) {
        TONK_DEBUG_BREAK(); // Invalid input
        return;
    }

    void* history = History.Allocate(MaxCompressedMessagesBytes);
    memcpy(history, data, bytes);
    ZSTD_insertBlock(DCtx, history, bytes);
    History.Commit(bytes);
}